

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QUnicodeTables::convertCase<QString_const>
          (QString *__return_storage_ptr__,QUnicodeTables *this,QString *str,Case which)

{
  long lVar1;
  const_iterator pQVar2;
  long lVar3;
  Data *pDVar4;
  uint uVar5;
  QStringIterator it;
  char16_t *pcVar6;
  long lVar7;
  long lVar8;
  const_iterator pQVar9;
  uint uVar10;
  const_iterator pQVar11;
  const_iterator pQVar12;
  uint uVar13;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(const_iterator *)(this + 8);
  lVar3 = *(long *)(this + 0x10);
  lVar7 = lVar3 * 2;
  do {
    lVar8 = lVar7;
    pQVar9 = pQVar2;
    if (lVar8 == 0) goto LAB_00333200;
    lVar7 = lVar8 + -2;
  } while ((*(ushort *)((long)&pQVar2[-1].ucs + lVar8) & 0xfc00) == 0xd800);
  pQVar9 = (const_iterator)((long)&pQVar2->ucs + lVar8);
LAB_00333200:
  pQVar11 = pQVar2;
  do {
    if (pQVar9 <= pQVar11) {
      pDVar4 = *(Data **)this;
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr = &pQVar2->ucs;
      (__return_storage_ptr__->d).size = lVar3;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_003333a8;
    }
    pQVar12 = pQVar11 + 1;
    uVar13 = (uint)(ushort)pQVar11->ucs;
    uVar10 = uVar13;
    if (((((uVar13 & 0xf800) == 0xd800) && (uVar10 = 0xfffd, (pQVar11->ucs & 0xdc00U) == 0xd800)) &&
        (pQVar12 < pQVar9)) && (pcVar6 = &pQVar12->ucs, (*pcVar6 & 0xfc00U) == 0xdc00)) {
      pQVar12 = pQVar11 + 2;
      uVar10 = uVar13 * 0x400 + (uint)(ushort)*pcVar6 + 0xfca02400;
    }
    uVar13 = 0xff;
    if (uVar10 < 0x11000) {
      uVar13 = 0x1f;
    }
    uVar5 = (uVar10 - 0x11000 >> 8) + 0x880;
    if (uVar10 < 0x11000) {
      uVar5 = uVar10 >> 5;
    }
    pQVar11 = pQVar12;
  } while (*(ushort *)
            ((ulong)*(ushort *)
                     (uc_property_trie +
                     (ulong)((uVar13 & uVar10) +
                            (uint)*(ushort *)(uc_property_trie + (ulong)uVar5 * 2)) * 2) * 0x14 +
             0x54b148 + ((ulong)str & 0xffffffff) * 2) < 2);
  pQVar11 = pQVar12 + -1;
  if ((((pQVar12[-1].ucs & 0xfc00U) == 0xdc00) && (pQVar11 != pQVar2)) &&
     ((pQVar12[-2].ucs & 0xfc00U) == 0xd800)) {
    pQVar11 = pQVar12 + -2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    it.pos = pQVar11;
    it.i = pQVar2;
    it.e = pQVar9;
    detachAndConvertCase<QString_const>(__return_storage_ptr__,this,str,it,(Case)pQVar9);
    return __return_storage_ptr__;
  }
LAB_003333a8:
  __stack_chk_fail();
}

Assistant:

static QString convertCase(T &str, QUnicodeTables::Case which)
{
    const QChar *p = str.constBegin();
    const QChar *e = p + str.size();

    // this avoids out of bounds check in the loop
    while (e != p && e[-1].isHighSurrogate())
        --e;

    QStringIterator it(p, e);
    while (it.hasNext()) {
        const char32_t uc = it.next();
        if (qGetProp(uc)->cases[which].diff) {
            it.recede();
            return detachAndConvertCase(str, it, which);
        }
    }
    return std::move(str);
}